

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

bool Js::SimpleTypeHandler<2UL>::DoConvertToPathType(DynamicType *type)

{
  bool bVar1;
  
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01447bf0,ShareCrossSiteFuncTypesPhase);
  if ((((!bVar1) ||
       (bVar1 = CrossSite::IsThunk((JavascriptMethod)(type->super_Type).entryPoint), !bVar1)) &&
      ((((type->typeHandler).ptr)->flags & 0x20) == 0)) &&
     ((bVar1 = Phases::IsEnabled((Phases *)&DAT_01441eb0,ShareFuncTypesPhase), !bVar1 ||
      ((type->super_Type).typeId != TypeIds_Function)))) {
    return true;
  }
  return false;
}

Assistant:

bool SimpleTypeHandler<size>::DoConvertToPathType(DynamicType* type)
    {
        if ((PHASE_ON1(ShareCrossSiteFuncTypesPhase) && CrossSite::IsThunk(type->GetEntryPoint())) || type->GetTypeHandler()->GetIsPrototype())
        {
            return false;
        }

        if (PHASE_OFF1(ShareFuncTypesPhase))
        {
            if (type->GetTypeId() == TypeIds_Function)
            {
                return false;
            }
        }

        return true;
    }